

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

int lest::select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
                timeval *__timeout)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  bool bVar4;
  int iVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  undefined1 *extraout_RAX;
  undefined1 *puVar7;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint uVar8;
  undefined1 *puVar9;
  byte bVar10;
  char *pcVar11;
  long *plVar12;
  undefined4 in_register_0000003c;
  _Alloc_hider _Var13;
  pointer pbVar14;
  long *plVar15;
  anon_class_1_0_00000001 hidden;
  anon_class_1_0_00000001 local_121;
  char *local_120;
  long *local_118;
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  fd_set *local_b0;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  text local_88;
  text local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  plVar12 = (long *)CONCAT44(in_register_0000003c,__nfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__readfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,*plVar12,plVar12[1] + *plVar12);
    bVar4 = select::anon_class_1_0_00000001::operator()(&local_121,&local_68);
    uVar8 = (uint)CONCAT71(extraout_var,bVar4) ^ 1;
    _Var13._M_p = local_68._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_0010b15d;
  }
  else {
    local_120 = (char *)((ulong)local_120 & 0xffffffff00000000);
    pbVar14 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    plVar15 = (long *)__readfds->fds_bits[1];
    local_118 = plVar12;
    local_b0 = __readfds;
    do {
      plVar3 = plVar15;
      plVar15 = plVar3 + -4;
      plVar1 = (long *)local_b0->fds_bits[0];
      if (plVar3 == plVar1) {
        uVar8 = (uint)pbVar14;
        break;
      }
      iVar5 = std::__cxx11::string::compare((char *)plVar15);
      __exceptfds = (fd_set *)CONCAT71((int7)((ulong)__exceptfds >> 8),1);
      if (iVar5 == 0) {
        bVar4 = false;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)plVar15);
        if (iVar5 != 0) {
          local_d0 = local_c0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,*plVar15,plVar3[-3] + *plVar15);
          local_f0 = local_e0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,*plVar12,plVar12[1] + *plVar12);
          __exceptfds = (fd_set *)(local_d0 + local_c8);
          _Var6 = std::
                  __search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<lest::search(std::__cxx11::string,std::__cxx11::string)::_lambda(char,char)_1_>>
                            (local_f0,local_f0 + local_e8,local_d0,__exceptfds);
          pcVar11 = local_f0 + local_e8;
          if (local_f0 != local_e0) {
            operator_delete(local_f0);
          }
          if (local_d0 != local_c0) {
            operator_delete(local_d0);
          }
          plVar12 = local_118;
          if (_Var6._M_current == pcVar11) {
            if (*(char *)*plVar15 == '!') {
              std::__cxx11::string::substr((ulong)&local_a8,(ulong)plVar15);
              local_110 = local_100;
              lVar2 = *plVar12;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_110,lVar2,plVar12[1] + lVar2);
              puVar9 = local_a8 + local_a0;
              local_120 = (char *)std::
                                  __search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<lest::search(std::__cxx11::string,std::__cxx11::string)::_lambda(char,char)_1_>>
                                            (local_110,local_110 + local_108,local_a8,puVar9);
              pcVar11 = local_110 + local_108;
              bVar4 = local_120 == pcVar11;
              if (local_110 != local_100) {
                operator_delete(local_110);
              }
              puVar7 = local_98;
              if (local_a8 != puVar7) {
                operator_delete(local_a8);
                puVar7 = extraout_RAX;
              }
              __exceptfds = (fd_set *)
                            CONCAT71((int7)((ulong)puVar9 >> 8),local_120 == pcVar11 & (byte)pbVar14
                                    );
              local_120 = (char *)CONCAT44(local_120._4_4_,
                                           (int)CONCAT71((int7)((ulong)puVar7 >> 8),1));
              plVar12 = local_118;
            }
            else {
              bVar4 = true;
              local_120 = (char *)((ulong)local_120 & 0xffffffff00000000);
              __exceptfds = (fd_set *)((ulong)pbVar14 & 0xffffffff);
            }
            goto LAB_0010afb2;
          }
        }
        bVar4 = false;
        __exceptfds = (fd_set *)CONCAT71((int7)((ulong)__exceptfds >> 8),1);
      }
LAB_0010afb2:
      uVar8 = (uint)__exceptfds;
      pbVar14 = (pointer)((ulong)__exceptfds & 0xffffffff);
    } while (bVar4);
    if (plVar3 != plVar1) goto LAB_0010b15d;
    bVar10 = (byte)local_120;
    if (((ulong)local_120 & 1) == 0) {
      uVar8 = 0;
    }
    else {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_88,*plVar12,plVar12[1] + *plVar12);
      bVar4 = select::anon_class_1_0_00000001::operator()(&local_121,&local_88);
      uVar8 = (uint)CONCAT71(extraout_var_00,bVar4) ^ 1;
    }
    _Var13._M_p = local_88._M_dataplus._M_p;
    if ((bVar10 & (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) == 0) goto LAB_0010b15d;
  }
  operator_delete(_Var13._M_p);
LAB_0010b15d:
  return uVar8 & 0xffffff01;
}

Assistant:

inline bool select( text name, texts include )
{
    auto none = []( texts args ) { return args.size() == 0; };

#if lest_FEATURE_REGEX_SEARCH
    auto hidden = []( text arg ){ return match( { "\\[\\..*", "\\[hide\\]" }, arg ); };
#else
    auto hidden = []( text arg ){ return match( { "[.", "[hide]" }, arg ); };
#endif

    if ( none( include ) )
    {
        return ! hidden( name );
    }

    bool any = false;
    for ( auto pos = include.rbegin(); pos != include.rend(); ++pos )
    {
        auto & part = *pos;

        if ( part == "@" || part == "*" )
            return true;

        if ( search( part, name ) )
            return true;

        if ( '!' == part[0] )
        {
            any = true;
            if ( search( part.substr(1), name ) )
                return false;
        }
        else
        {
            any = false;
        }
    }
    return any && ! hidden( name );
}